

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O0

void init_neighbor_pred_buf(OBMCBuffer *obmc_buffer,HandleInterModeArgs *args,int is_hbd)

{
  int len;
  int is_hbd_local;
  HandleInterModeArgs *args_local;
  OBMCBuffer *obmc_buffer_local;
  
  if (is_hbd == 0) {
    args->above_pred_buf[0] = obmc_buffer->above_pred;
    args->above_pred_buf[1] = obmc_buffer->above_pred + 0x2000;
    args->above_pred_buf[2] = obmc_buffer->above_pred + 0x4000;
    args->left_pred_buf[0] = obmc_buffer->left_pred;
    args->left_pred_buf[1] = obmc_buffer->left_pred + 0x2000;
    args->left_pred_buf[2] = obmc_buffer->left_pred + 0x4000;
  }
  else {
    args->above_pred_buf[0] = (uint8_t *)((ulong)obmc_buffer->above_pred >> 1);
    args->above_pred_buf[1] = (uint8_t *)((ulong)(obmc_buffer->above_pred + 0x4000) >> 1);
    args->above_pred_buf[2] = (uint8_t *)((ulong)(obmc_buffer->above_pred + 0x8000) >> 1);
    args->left_pred_buf[0] = (uint8_t *)((ulong)obmc_buffer->left_pred >> 1);
    args->left_pred_buf[1] = (uint8_t *)((ulong)(obmc_buffer->left_pred + 0x4000) >> 1);
    args->left_pred_buf[2] = (uint8_t *)((ulong)(obmc_buffer->left_pred + 0x8000) >> 1);
  }
  return;
}

Assistant:

static inline void init_neighbor_pred_buf(const OBMCBuffer *const obmc_buffer,
                                          HandleInterModeArgs *const args,
                                          int is_hbd) {
  if (is_hbd) {
    const int len = sizeof(uint16_t);
    args->above_pred_buf[0] = CONVERT_TO_BYTEPTR(obmc_buffer->above_pred);
    args->above_pred_buf[1] = CONVERT_TO_BYTEPTR(obmc_buffer->above_pred +
                                                 (MAX_SB_SQUARE >> 1) * len);
    args->above_pred_buf[2] =
        CONVERT_TO_BYTEPTR(obmc_buffer->above_pred + MAX_SB_SQUARE * len);
    args->left_pred_buf[0] = CONVERT_TO_BYTEPTR(obmc_buffer->left_pred);
    args->left_pred_buf[1] =
        CONVERT_TO_BYTEPTR(obmc_buffer->left_pred + (MAX_SB_SQUARE >> 1) * len);
    args->left_pred_buf[2] =
        CONVERT_TO_BYTEPTR(obmc_buffer->left_pred + MAX_SB_SQUARE * len);
  } else {
    args->above_pred_buf[0] = obmc_buffer->above_pred;
    args->above_pred_buf[1] = obmc_buffer->above_pred + (MAX_SB_SQUARE >> 1);
    args->above_pred_buf[2] = obmc_buffer->above_pred + MAX_SB_SQUARE;
    args->left_pred_buf[0] = obmc_buffer->left_pred;
    args->left_pred_buf[1] = obmc_buffer->left_pred + (MAX_SB_SQUARE >> 1);
    args->left_pred_buf[2] = obmc_buffer->left_pred + MAX_SB_SQUARE;
  }
}